

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O2

size_t __thiscall
delaunator::Delaunator::add_triangle
          (Delaunator *this,size_t i0,size_t i1,size_t i2,size_t a,size_t b,size_t c)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  char *__from;
  size_t local_58;
  size_t i0_local;
  size_t i1_local;
  size_t i2_local;
  char *local_38;
  
  this_00 = &this->triangles;
  __from = (char *)((long)(this->triangles).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->triangles).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
  local_58 = i0;
  i0_local = i1;
  i1_local = i2;
  i2_local = b;
  local_38 = (char *)a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&local_58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&i0_local);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&i1_local);
  link(this,__from,local_38);
  link(this,__from + 1,(char *)i2_local);
  link(this,__from + 2,(char *)c);
  return (size_t)__from;
}

Assistant:

std::size_t Delaunator::add_triangle(
    std::size_t i0,
    std::size_t i1,
    std::size_t i2,
    std::size_t a,
    std::size_t b,
    std::size_t c) {
    std::size_t t = triangles.size();
    triangles.push_back(i0);
    triangles.push_back(i1);
    triangles.push_back(i2);
    link(t, a);
    link(t + 1, b);
    link(t + 2, c);
    return t;
}